

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

Chainstate * __thiscall
ChainstateManager::ActivateExistingSnapshot(ChainstateManager *this,uint256 base_blockhash)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  pointer pCVar3;
  type pCVar4;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_000000b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff0c;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_stack_ffffffffffffff10;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_stack_ffffffffffffff18;
  CTxMemPool *this_00;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  int line;
  char *in_stack_ffffffffffffff40;
  CTxMemPool *pCVar6;
  bool *in_stack_ffffffffffffff48;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *val;
  Chainstate *in_stack_ffffffffffffff50;
  uint256 *__args_3;
  BlockManager *in_stack_ffffffffffffff80;
  void **in_stack_ffffffffffffff88;
  ConstevalFormatString<1U> in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *pcVar7;
  string_view in_stack_ffffffffffffffd0;
  
  __args_3 = (uint256 *)&stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_snapshot_chainstate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1889,"Chainstate &ChainstateManager::ActivateExistingSnapshot(uint256)");
  }
  pcVar7 = (char *)0x0;
  std::make_unique<Chainstate,decltype(nullptr),node::BlockManager&,ChainstateManager&,uint256&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_RDI,__args_3);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator=
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr
            (in_stack_ffffffffffffff18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  this_00 = (CTxMemPool *)&stack0xffffffffffffffd8;
  Chainstate::ToString_abi_cxx11_(in_stack_ffffffffffffff50);
  uVar5 = 2;
  source_file._M_str = pcVar7;
  source_file._M_len = in_stack_ffffffffffffffc0;
  LogPrintFormatInternal<std::__cxx11::string>
            (in_stack_ffffffffffffffd0,source_file,(int)((ulong)in_RDI >> 0x20),(LogFlags)__args_3,
             in_stack_000000b0,in_stack_ffffffffffffffb8,in_stack_000000c0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,uVar5));
  CTxMemPool::size(this_00);
  pcVar7 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp";
  line = 0;
  inline_assertion_check<true,bool>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,(char *)in_stack_ffffffffffffff28);
  val = &in_RDI->m_snapshot_chainstate;
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,uVar5));
  inline_assertion_check<true,bool>
            ((bool *)val,in_stack_ffffffffffffff40,line,pcVar7,(char *)in_stack_ffffffffffffff28);
  pCVar6 = in_RDI->m_active_chainstate->m_mempool;
  pCVar3 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                     ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                      CONCAT44(in_stack_ffffffffffffff0c,uVar5));
  pCVar3->m_mempool = pCVar6;
  in_RDI->m_active_chainstate->m_mempool = (CTxMemPool *)0x0;
  pCVar3 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
                     ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                      CONCAT44(in_stack_ffffffffffffff0c,uVar5));
  in_RDI->m_active_chainstate = pCVar3;
  pCVar4 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator*
                     ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate& ChainstateManager::ActivateExistingSnapshot(uint256 base_blockhash)
{
    assert(!m_snapshot_chainstate);
    m_snapshot_chainstate =
        std::make_unique<Chainstate>(nullptr, m_blockman, *this, base_blockhash);
    LogPrintf("[snapshot] switching active chainstate to %s\n", m_snapshot_chainstate->ToString());

    // Mempool is empty at this point because we're still in IBD.
    Assert(m_active_chainstate->m_mempool->size() == 0);
    Assert(!m_snapshot_chainstate->m_mempool);
    m_snapshot_chainstate->m_mempool = m_active_chainstate->m_mempool;
    m_active_chainstate->m_mempool = nullptr;
    m_active_chainstate = m_snapshot_chainstate.get();
    return *m_snapshot_chainstate;
}